

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qp2passes.hpp
# Opt level: O0

QP2PassNodeResult __thiscall
mp::QP2PassVisitor::VisitAtmostAffine(QP2PassVisitor *this,Expr e,AffineExpr *ae)

{
  unkbyte10 Var1;
  QP2PassNodeResult QVar2;
  undefined8 in_RDX;
  long in_RDI;
  QP2PassNodeResult result;
  int mode_save;
  AffineExpr *pae_save;
  longdouble f_save;
  AlgebraicExpression<mp::LinTerms> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar3;
  ExprBase e_00;
  
  Var1 = *(unkbyte10 *)(in_RDI + 0x20);
  *(longdouble *)(in_RDI + 0x20) = (longdouble)1;
  e_00.impl_ = *(Impl **)(in_RDI + 0x30);
  *(undefined8 *)(in_RDI + 0x30) = in_RDX;
  AlgebraicExpression<mp::LinTerms>::clear(in_stack_ffffffffffffffc0);
  uVar3 = *(undefined4 *)(in_RDI + 0x14);
  if (1 < *(int *)(in_RDI + 0x14)) {
    *(undefined4 *)(in_RDI + 0x14) = 1;
  }
  QVar2 = Visit((QP2PassVisitor *)CONCAT44(uVar3,in_stack_ffffffffffffffc8),(Expr)e_00.impl_);
  *(undefined4 *)(in_RDI + 0x14) = uVar3;
  *(Impl **)(in_RDI + 0x30) = e_00.impl_;
  *(unkbyte10 *)(in_RDI + 0x20) = Var1;
  return QVar2;
}

Assistant:

QP2PassNodeResult QP2PassVisitor::VisitAtmostAffine(
    Expr e, AffineExpr& ae) {
  auto f_save = factor_;
  factor_ = 1.0;
  auto pae_save = p_ae_;
  p_ae_ = &ae;
  ae.clear();
  auto mode_save = mode_;
  if (mode_>1)                  // at most linear mode
    mode_ = 1;
  auto result = Visit(e);
  mode_ = mode_save;
  p_ae_ = pae_save;
  factor_ = f_save;
  return result;
}